

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::GetInterpolationOrder
          (TPZCompElH1<pzshape::TPZShapePrism> *this,TPZVec<int> *ord)

{
  long lVar1;
  long lVar2;
  
  (*ord->_vptr_TPZVec[3])(ord,0xf);
  lVar2 = 0;
  do {
    lVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,(int)lVar2 + 6);
    ord->fStore[lVar2] = (uint)*(byte *)(lVar1 + 0x14);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xf);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::GetInterpolationOrder(TPZVec<int> &ord) {
	ord.Resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
	int i;
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
}